

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

_Bool mtrap_action(menu *menu,ui_event *db,wchar_t oid)

{
  void *pvVar1;
  
  pvVar1 = menu_priv((menu_conflict *)menu);
  square_remove_all_traps((chunk *)cave,mtrap_grid);
  player->num_traps = player->num_traps + 0xff;
  place_trap((chunk *)cave,mtrap_grid,*(wchar_t *)((long)pvVar1 + (long)oid * 0x88 + 0x40),L'\0');
  return false;
}

Assistant:

static bool mtrap_action(struct menu *menu, const ui_event *db, int oid)
{
	const struct trap_kind *choice = menu_priv(menu);

	/* Remove the old trap */
	square_remove_all_traps(cave, mtrap_grid);
	player->num_traps--;

	/* Place the new trap */
	place_trap(cave, mtrap_grid, choice[oid].tidx, 0);

	return false;
}